

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::callbackUserSolution
          (HighsMipSolverData *this,double mipsolver_objective_value,
          HighsInt user_solution_callback_origin)

{
  value_type vVar1;
  bool bVar2;
  byte bVar3;
  reference pvVar4;
  undefined4 in_ESI;
  long *in_RDI;
  HighsLogOptions *log_options_;
  bool is_user_solution;
  bool print_display_line;
  vector<double,_std::allocator<double>_> reduced_user_solution;
  double user_solution_objective_value;
  bool feasible;
  HighsCDouble user_solution_quad_objective_value;
  double integrality_violation_;
  double row_violation_;
  double bound_violation_;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> user_solution;
  bool interrupt;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  allocator_type *in_stack_fffffffffffffec0;
  double in_stack_fffffffffffffec8;
  HighsMipSolverData *in_stack_fffffffffffffed0;
  string *message;
  allocator *paVar5;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  allocator_type local_e0 [2];
  undefined1 in_stack_ffffffffffffff22;
  undefined1 in_stack_ffffffffffffff23;
  int in_stack_ffffffffffffff24;
  double in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  HighsMipSolverData *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff60;
  HighsPostsolveStack *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *pass_row_value;
  vector<double,_std::allocator<double>_> *col_value;
  HighsLp *lp;
  int iVar6;
  undefined4 in_stack_ffffffffffffff94;
  double *in_stack_ffffffffffffffa0;
  HighsCDouble *in_stack_ffffffffffffffa8;
  allocator local_39;
  string local_38 [35];
  undefined1 local_15;
  undefined4 local_14;
  
  local_14 = in_ESI;
  setCallbackDataOut(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  *(undefined4 *)(*(long *)*in_RDI + 0xe8) = local_14;
  HighsCallback::clearHighsCallbackDataIn(*(HighsCallback **)*in_RDI);
  message = *(string **)*in_RDI;
  paVar5 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"MIP User solution",paVar5);
  bVar2 = HighsCallback::callbackAction
                    ((HighsCallback *)
                     CONCAT17(in_stack_ffffffffffffff1f,
                              CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),
                     (int)((ulong)paVar5 >> 0x20),message);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(long *)(*(long *)*in_RDI + 0xf8) != 0) {
    local_15 = bVar2;
    std::allocator<double>::allocator((allocator<double> *)0x62ecde);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
               (size_type)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::allocator<double>::~allocator((allocator<double> *)0x62ed04);
    for (iVar6 = 0; iVar6 < **(int **)(*in_RDI + 0x18); iVar6 = iVar6 + 1) {
      vVar1 = *(value_type *)(*(long *)(*(long *)*in_RDI + 0xf8) + (long)iVar6 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff98,
                          (long)iVar6);
      *pvVar4 = vVar1;
    }
    lp = (HighsLp *)0x0;
    col_value = (vector<double,_std::allocator<double>_> *)0x0;
    pass_row_value = (vector<double,_std::allocator<double>_> *)0x0;
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffff68,0.0);
    bVar3 = HighsMipSolver::solutionFeasible
                      ((HighsMipSolver *)CONCAT44(in_stack_ffffffffffffff94,iVar6),lp,col_value,
                       pass_row_value,in_stack_ffffffffffffff70,(double *)in_stack_ffffffffffffff68,
                       in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
    log_options_ = (HighsLogOptions *)
                   HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xffffffffffffff68);
    if ((bVar3 & 1) == 0) {
      highsLogUser(log_options_,(HighsLogType)lp,(char *)pass_row_value,col_value,
                   *(long *)(*in_RDI + 8) + 0x380,4,
                   "User-supplied solution has with objective %g has violations: bound = %.4g; integrality = %.4g; row = %.4g\n"
                  );
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x62ef30);
      presolve::HighsPostsolveStack::getReducedPrimalSolution
                (in_stack_ffffffffffffff68,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT17(bVar3,in_stack_ffffffffffffff60));
      in_stack_fffffffffffffec0 = local_e0;
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0);
      addIncumbent(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff24,(bool)in_stack_ffffffffffffff23,
                   (bool)in_stack_ffffffffffffff22);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0);
  }
  return;
}

Assistant:

void HighsMipSolverData::callbackUserSolution(
    const double mipsolver_objective_value,
    const HighsInt user_solution_callback_origin) {
  setCallbackDataOut(mipsolver_objective_value);
  mipsolver.callback_->data_out.user_solution_callback_origin =
      user_solution_callback_origin;

  mipsolver.callback_->clearHighsCallbackDataIn();
  const bool interrupt = mipsolver.callback_->callbackAction(
      kCallbackMipUserSolution, "MIP User solution");
  assert(!interrupt);
  if (mipsolver.callback_->data_in.user_solution) {
    std::vector<double> user_solution(mipsolver.orig_model_->num_col_);
    for (HighsInt iCol = 0; iCol < mipsolver.orig_model_->num_col_; iCol++)
      user_solution[iCol] = mipsolver.callback_->data_in.user_solution[iCol];
    double bound_violation_ = 0;
    double row_violation_ = 0;
    double integrality_violation_ = 0;
    HighsCDouble user_solution_quad_objective_value = 0;
    const bool feasible = mipsolver.solutionFeasible(
        mipsolver.orig_model_, user_solution, nullptr, bound_violation_,
        row_violation_, integrality_violation_,
        user_solution_quad_objective_value);
    double user_solution_objective_value =
        double(user_solution_quad_objective_value);
    if (!feasible) {
      highsLogUser(
          mipsolver.options_mip_->log_options, HighsLogType::kWarning,
          "User-supplied solution has with objective %g has violations: "
          "bound = %.4g; integrality = %.4g; row = %.4g\n",
          user_solution_objective_value, bound_violation_,
          integrality_violation_, row_violation_);
      return;
    }
    std::vector<double> reduced_user_solution;
    reduced_user_solution =
        postSolveStack.getReducedPrimalSolution(user_solution);
    const bool print_display_line = true;
    const bool is_user_solution = true;
    addIncumbent(reduced_user_solution, user_solution_objective_value,
                 kSolutionSourceUserSolution, print_display_line,
                 is_user_solution);
  }
}